

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O2

void __thiscall sighash_tests::sighash_test::test_method(sighash_test *this)

{
  FastRandomContext *this_00;
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  iterator pvVar5;
  unsigned_long uVar6;
  uint nOut;
  uint nIn;
  HashWriter *amount;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar10;
  char local_298;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  CMutableTransaction txTo;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_210;
  CMutableTransaction txTmp;
  CTransaction local_1c8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_148;
  uint256 local_128;
  uint256 sho;
  uint256 sh;
  CScript scriptCode;
  HashWriter ss;
  uint obj;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_rng;
  iVar4 = 0;
  do {
    if (iVar4 == 50000) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    pvVar5 = (iterator)
             RandomMixin<FastRandomContext>::randbits<32>
                       (&this_00->super_RandomMixin<FastRandomContext>);
    CMutableTransaction::CMutableTransaction(&txTo);
    obj = (uint)pvVar5;
    uVar7 = obj & 0x1f;
    SigHashTest::RandomTransaction(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&txTo,uVar7 == 3);
    scriptCode.super_CScriptBase._union._16_8_ = 0;
    scriptCode.super_CScriptBase._24_8_ = 0;
    scriptCode.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    scriptCode.super_CScriptBase._union._8_8_ = 0;
    SigHashTest::RandomScript
              (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,(CScript *)&scriptCode.super_CScriptBase);
    uVar6 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&this_00->super_RandomMixin<FastRandomContext>,
                       ((long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)txTo.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x68);
    sh.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    sh.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    sho.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              (&local_148,&scriptCode.super_CScriptBase);
    CTransaction::CTransaction(&local_1c8,&txTo);
    nIn = (uint)uVar6;
    uVar9 = uVar6 & 0xffffffff;
    if (uVar9 < (ulong)((CONCAT71(local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._1_7_,
                                  (uchar)local_1c8.vin.
                                         super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                         super__Vector_impl_data._M_finish) -
                        (long)local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68)) {
      CMutableTransaction::CMutableTransaction(&txTmp,&local_1c8);
      CScript::CScript((CScript *)&ss.ctx,OP_CODESEPARATOR);
      FindAndDelete((CScript *)&local_148,(CScript *)&ss.ctx);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ss.ctx);
      uVar3 = 0;
      while( true ) {
        if ((ulong)(((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x68) <= (ulong)uVar3) break;
        ss.ctx.s[4] = 0;
        ss.ctx.s[5] = 0;
        ss.ctx.s[6] = 0;
        ss.ctx.s[7] = 0;
        ss.ctx.s[0] = 0;
        ss.ctx.s[1] = 0;
        ss.ctx.s[2] = 0;
        ss.ctx.s[3] = 0;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3].scriptSig.super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ss.ctx);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&ss.ctx);
        uVar3 = uVar3 + 1;
      }
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9].scriptSig.super_CScriptBase,&local_148);
      if (uVar7 == 3) {
        if (uVar9 < (ulong)(((long)txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                  _M_impl.super__Vector_impl_data._M_start) / 0x28)) {
          std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&txTmp.vout,(ulong)(nIn + 1));
          for (lVar8 = 0; uVar9 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
            CTxOut::SetNull((CTxOut *)
                            ((long)&(txTmp.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->nValue + lVar8));
          }
          for (uVar7 = 0;
              (ulong)uVar7 <
              (ulong)(((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x68); uVar7 = uVar7 + 1) {
            if (nIn != uVar7) {
              txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7].nSequence = 0;
            }
          }
          goto LAB_00502879;
        }
        local_128.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
        local_128.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        local_128.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      }
      else {
        if (uVar7 == 2) {
          std::vector<CTxOut,_std::allocator<CTxOut>_>::clear(&txTmp.vout);
          for (uVar7 = 0;
              (ulong)uVar7 <
              (ulong)(((long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start) / 0x68); uVar7 = uVar7 + 1) {
            if (nIn != uVar7) {
              txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7].nSequence = 0;
            }
          }
        }
LAB_00502879:
        local_298 = (char)pvVar5;
        if (local_298 < '\0') {
          CTxIn::operator=(txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar9);
          std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&txTmp.vin,1);
        }
        ss.ctx.buf[0x30] = '\0';
        ss.ctx.buf[0x31] = '\0';
        ss.ctx.buf[0x32] = '\0';
        ss.ctx.buf[0x33] = '\0';
        ss.ctx.buf[0x34] = '\0';
        ss.ctx.buf[0x35] = '\0';
        ss.ctx.buf[0x36] = '\0';
        ss.ctx.buf[0x37] = '\0';
        ss.ctx.buf[0x38] = '\0';
        ss.ctx.buf[0x39] = '\0';
        ss.ctx.buf[0x3a] = '\0';
        ss.ctx.buf[0x3b] = '\0';
        ss.ctx.buf[0x3c] = '\0';
        ss.ctx.buf[0x3d] = '\0';
        ss.ctx.buf[0x3e] = '\0';
        ss.ctx.buf[0x3f] = '\0';
        ss.ctx.buf[0x20] = '\0';
        ss.ctx.buf[0x21] = '\0';
        ss.ctx.buf[0x22] = '\0';
        ss.ctx.buf[0x23] = '\0';
        ss.ctx.buf[0x24] = '\0';
        ss.ctx.buf[0x25] = '\0';
        ss.ctx.buf[0x26] = '\0';
        ss.ctx.buf[0x27] = '\0';
        ss.ctx.buf[0x28] = '\0';
        ss.ctx.buf[0x29] = '\0';
        ss.ctx.buf[0x2a] = '\0';
        ss.ctx.buf[0x2b] = '\0';
        ss.ctx.buf[0x2c] = '\0';
        ss.ctx.buf[0x2d] = '\0';
        ss.ctx.buf[0x2e] = '\0';
        ss.ctx.buf[0x2f] = '\0';
        ss.ctx.buf[0x10] = '\0';
        ss.ctx.buf[0x11] = '\0';
        ss.ctx.buf[0x12] = '\0';
        ss.ctx.buf[0x13] = '\0';
        ss.ctx.buf[0x14] = '\0';
        ss.ctx.buf[0x15] = '\0';
        ss.ctx.buf[0x16] = '\0';
        ss.ctx.buf[0x17] = '\0';
        ss.ctx.buf[0x18] = '\0';
        ss.ctx.buf[0x19] = '\0';
        ss.ctx.buf[0x1a] = '\0';
        ss.ctx.buf[0x1b] = '\0';
        ss.ctx.buf[0x1c] = '\0';
        ss.ctx.buf[0x1d] = '\0';
        ss.ctx.buf[0x1e] = '\0';
        ss.ctx.buf[0x1f] = '\0';
        ss.ctx.buf[0] = '\0';
        ss.ctx.buf[1] = '\0';
        ss.ctx.buf[2] = '\0';
        ss.ctx.buf[3] = '\0';
        ss.ctx.buf[4] = '\0';
        ss.ctx.buf[5] = '\0';
        ss.ctx.buf[6] = '\0';
        ss.ctx.buf[7] = '\0';
        ss.ctx.buf[8] = '\0';
        ss.ctx.buf[9] = '\0';
        ss.ctx.buf[10] = '\0';
        ss.ctx.buf[0xb] = '\0';
        ss.ctx.buf[0xc] = '\0';
        ss.ctx.buf[0xd] = '\0';
        ss.ctx.buf[0xe] = '\0';
        ss.ctx.buf[0xf] = '\0';
        ss.ctx.s[4] = 0;
        ss.ctx.s[5] = 0;
        ss.ctx.s[6] = 0;
        ss.ctx.s[7] = 0;
        ss.ctx.s[0] = 0;
        ss.ctx.s[1] = 0;
        ss.ctx.s[2] = 0;
        ss.ctx.s[3] = 0;
        ss.ctx.bytes = 0;
        CSHA256::CSHA256(&ss.ctx);
        local_210.m_params = &::TX_NO_WITNESS;
        local_210.m_object = &txTmp;
        ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Serialize<HashWriter>
                  (&local_210,(HashWriter *)&ss.ctx);
        ser_writedata32<HashWriter>((HashWriter *)&ss.ctx,obj);
        HashWriter::GetHash(&local_128,(HashWriter *)&ss.ctx);
      }
      CMutableTransaction::~CMutableTransaction(&txTmp);
    }
    else {
      local_128.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0] = '\x01';
      local_128.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      local_128.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    }
    sho.super_base_blob<256U>.m_data._M_elems[0x10] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x10];
    sho.super_base_blob<256U>.m_data._M_elems[0x11] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x11];
    sho.super_base_blob<256U>.m_data._M_elems[0x12] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x12];
    sho.super_base_blob<256U>.m_data._M_elems[0x13] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x13];
    sho.super_base_blob<256U>.m_data._M_elems[0x14] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x14];
    sho.super_base_blob<256U>.m_data._M_elems[0x15] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x15];
    sho.super_base_blob<256U>.m_data._M_elems[0x16] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x16];
    sho.super_base_blob<256U>.m_data._M_elems[0x17] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x17];
    sho.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x18];
    sho.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x19];
    sho.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1a];
    sho.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1b];
    sho.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1c];
    sho.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1d];
    sho.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1e];
    sho.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_128.super_base_blob<256U>.m_data._M_elems[0x1f];
    sho.super_base_blob<256U>.m_data._M_elems[0] =
         local_128.super_base_blob<256U>.m_data._M_elems[0];
    sho.super_base_blob<256U>.m_data._M_elems[1] =
         local_128.super_base_blob<256U>.m_data._M_elems[1];
    sho.super_base_blob<256U>.m_data._M_elems[2] =
         local_128.super_base_blob<256U>.m_data._M_elems[2];
    sho.super_base_blob<256U>.m_data._M_elems[3] =
         local_128.super_base_blob<256U>.m_data._M_elems[3];
    sho.super_base_blob<256U>.m_data._M_elems[4] =
         local_128.super_base_blob<256U>.m_data._M_elems[4];
    sho.super_base_blob<256U>.m_data._M_elems[5] =
         local_128.super_base_blob<256U>.m_data._M_elems[5];
    sho.super_base_blob<256U>.m_data._M_elems[6] =
         local_128.super_base_blob<256U>.m_data._M_elems[6];
    sho.super_base_blob<256U>.m_data._M_elems[7] =
         local_128.super_base_blob<256U>.m_data._M_elems[7];
    sho.super_base_blob<256U>.m_data._M_elems[8] =
         local_128.super_base_blob<256U>.m_data._M_elems[8];
    sho.super_base_blob<256U>.m_data._M_elems[9] =
         local_128.super_base_blob<256U>.m_data._M_elems[9];
    sho.super_base_blob<256U>.m_data._M_elems[10] =
         local_128.super_base_blob<256U>.m_data._M_elems[10];
    sho.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xb];
    sho.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xc];
    sho.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xd];
    sho.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xe];
    sho.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_128.super_base_blob<256U>.m_data._M_elems[0xf];
    CTransaction::~CTransaction(&local_1c8);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_148);
    ss.ctx.s[0] = 0;
    ss.ctx.s[1] = 0;
    amount = &ss;
    SignatureHash<CMutableTransaction>
              ((uint256 *)&local_1c8,&scriptCode,&txTo,nIn,obj,(CAmount *)amount,BASE,
               (PrecomputedTransactionData *)0x0);
    sh.super_base_blob<256U>.m_data._M_elems._9_7_ =
         local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_finish._1_7_;
    sh.super_base_blob<256U>.m_data._M_elems[8] =
         (uchar)local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
    sh.super_base_blob<256U>.m_data._M_elems._16_8_ =
         local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    sh.super_base_blob<256U>.m_data._M_elems._24_8_ =
         local_1c8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_start;
    sh.super_base_blob<256U>.m_data._M_elems._0_8_ =
         local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_258 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
    ;
    local_250 = "";
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    local_260 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x9c;
    file.m_begin = (iterator)&local_258;
    msg.m_end = (iterator)amount;
    msg.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_268,msg);
    _cVar10 = 0x502a33;
    bVar2 = ::operator==(&sh.super_base_blob<256U>,&sho.super_base_blob<256U>);
    ss.ctx.s[0]._0_1_ = bVar2;
    ss.ctx.s[2] = 0;
    ss.ctx.s[3] = 0;
    ss.ctx.s[4] = 0;
    ss.ctx.s[5] = 0;
    txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)anon_var_dwarf_10448ff;
    txTmp.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0xc1c839;
    local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = '\0';
    local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_011481f0;
    local_1c8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    local_1c8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&txTmp;
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sighash_tests.cpp"
    ;
    local_270 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&ss,(lazy_ostream *)&local_1c8,1,0,WARN,_cVar10,
               (size_t)&local_278,0x9c);
    boost::detail::shared_count::~shared_count((shared_count *)(ss.ctx.s + 4));
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptCode.super_CScriptBase);
    CMutableTransaction::~CMutableTransaction(&txTo);
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(sighash_test)
{
    #if defined(PRINT_SIGHASH_JSON)
    std::cout << "[\n";
    std::cout << "\t[\"raw_transaction, script, input_index, hashType, signature_hash (result)\"],\n";
    int nRandomTests = 500;
    #else
    int nRandomTests = 50000;
    #endif
    for (int i=0; i<nRandomTests; i++) {
        int nHashType{int(m_rng.rand32())};
        CMutableTransaction txTo;
        RandomTransaction(txTo, (nHashType & 0x1f) == SIGHASH_SINGLE);
        CScript scriptCode;
        RandomScript(scriptCode);
        int nIn = m_rng.randrange(txTo.vin.size());

        uint256 sh, sho;
        sho = SignatureHashOld(scriptCode, CTransaction(txTo), nIn, nHashType);
        sh = SignatureHash(scriptCode, txTo, nIn, nHashType, 0, SigVersion::BASE);
        #if defined(PRINT_SIGHASH_JSON)
        DataStream ss;
        ss << TX_WITH_WITNESS(txTo);

        std::cout << "\t[\"" ;
        std::cout << HexStr(ss) << "\", \"";
        std::cout << HexStr(scriptCode) << "\", ";
        std::cout << nIn << ", ";
        std::cout << nHashType << ", \"";
        std::cout << sho.GetHex() << "\"]";
        if (i+1 != nRandomTests) {
          std::cout << ",";
        }
        std::cout << "\n";
        #endif
        BOOST_CHECK(sh == sho);
    }
    #if defined(PRINT_SIGHASH_JSON)
    std::cout << "]\n";
    #endif
}